

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void assert_solvers_result<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
               (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                *cost_matrix,duration<long,_boost::ratio<1L,_1L>_> expected_cost,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment,
               greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator)

{
  ostream *poVar1;
  _func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
  *local_40;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *local_38;
  _func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
  *local_30;
  greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *local_28;
  greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment_local;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *cost_matrix_local;
  duration<long,_boost::ratio<1L,_1L>_> expected_cost_local;
  
  local_28 = cost_comparator;
  cost_comparator_local =
       (greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *)expected_assignment;
  expected_assignment_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cost_matrix;
  cost_matrix_local =
       (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
        *)expected_cost.rep_;
  poVar1 = std::operator<<((ostream *)&std::cout,"  Testing Hungarian solver");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_30 = hungarian_algorithm::
             solve<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  ;
  local_38 = cost_matrix_local;
  assert_solver_result<boost::chrono::duration<long,boost::ratio<1l,1l>>(*)(boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>const&),boost::chrono::duration<long,boost::ratio<1l,1l>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
            (&local_30,
             (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
              *)expected_assignment_local,(duration<long,_boost::ratio<1L,_1L>_>)cost_matrix_local,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cost_comparator_local,local_28
            );
  poVar1 = std::operator<<((ostream *)&std::cout,"  Testing brute force solver");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_40 = hungarian_algorithm::
             solveBruteForce<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  ;
  assert_solver_result<boost::chrono::duration<long,boost::ratio<1l,1l>>(*)(boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>const&),boost::chrono::duration<long,boost::ratio<1l,1l>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
            (&local_40,
             (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
              *)expected_assignment_local,(duration<long,_boost::ratio<1L,_1L>_>)cost_matrix_local,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cost_comparator_local,local_28
            );
  return;
}

Assistant:

void assert_solvers_result(const ublas::matrix<Cost>& cost_matrix, const Cost expected_cost,
                           const std::vector<std::size_t>& expected_assignment,
                           const CostComparator& cost_comparator)
{
  typedef Cost SolvingFunction(const ublas::matrix<Cost>&, const std::size_t, const std::size_t,
                               std::vector<std::size_t>&, const CostComparator&);
  std::cout << "  Testing Hungarian solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
  std::cout << "  Testing brute force solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solveBruteForce), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
}